

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

QVariant * __thiscall
QTransposeProxyModel::headerData
          (QTransposeProxyModel *this,int section,Orientation orientation,int role)

{
  parameter_type pQVar1;
  arrow_operator_result ppQVar2;
  int in_ECX;
  undefined8 uVar3;
  uint in_EDX;
  QVariant *in_RDI;
  uint in_R8D;
  QTransposeProxyModelPrivate *d;
  QVariant *this_00;
  
  this_00 = in_RDI;
  d_func((QTransposeProxyModel *)0x8b34a5);
  pQVar1 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       *)0x8b34bb);
  if (pQVar1 == (parameter_type)0x0) {
    ::QVariant::QVariant((QVariant *)0x8b34ca);
  }
  else {
    ppQVar2 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                            *)this_00);
    uVar3 = 1;
    if (in_ECX == 1) {
      uVar3 = 2;
    }
    (*((*ppQVar2)->super_QObject)._vptr_QObject[0x14])
              (in_RDI,*ppQVar2,(ulong)in_EDX,uVar3,(ulong)in_R8D);
  }
  return this_00;
}

Assistant:

QVariant QTransposeProxyModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QTransposeProxyModel);
    if (!d->model)
        return QVariant();
    return d->model->headerData(section, orientation == Qt::Horizontal ? Qt::Vertical : Qt::Horizontal, role);
}